

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

string * __thiscall draco::Options::GetString(Options *this,string *name)

{
  string *in_RDI;
  string *default_val;
  string *in_stack_ffffffffffffffb0;
  Options *in_stack_ffffffffffffffb8;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  default_val = (string *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  GetString(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,default_val);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  return in_RDI;
}

Assistant:

std::string Options::GetString(const std::string &name) const {
  return GetString(name, "");
}